

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# partition_strategy.c
# Opt level: O2

int convert_bsize_to_idx(BLOCK_SIZE bsize)

{
  int iVar1;
  undefined3 in_register_00000039;
  
  switch(CONCAT31(in_register_00000039,bsize)) {
  case 6:
    iVar1 = 3;
    break;
  case 9:
    iVar1 = 2;
    break;
  case 0xc:
    iVar1 = 1;
    break;
  case 0xf:
    return 0;
  default:
    if (CONCAT31(in_register_00000039,bsize) == 3) {
      return 4;
    }
  case 7:
  case 8:
  case 10:
  case 0xb:
  case 0xd:
  case 0xe:
    iVar1 = -1;
  }
  return iVar1;
}

Assistant:

static inline int convert_bsize_to_idx(BLOCK_SIZE bsize) {
  switch (bsize) {
    case BLOCK_128X128: return 0;
    case BLOCK_64X64: return 1;
    case BLOCK_32X32: return 2;
    case BLOCK_16X16: return 3;
    case BLOCK_8X8: return 4;
    default: assert(0 && "Invalid bsize"); return -1;
  }
}